

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O1

int main(int argc,char **argv)

{
  ptls_aead_algorithm_t *aead;
  ptls_hash_algorithm_t *hash;
  size_t sVar1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  size_t sVar5;
  ptls_aead_context_t *ctx;
  ptls_aead_context_t *ctx_00;
  void *__s;
  byte *__ptr;
  uint8_t *puVar6;
  uint64_t uVar7;
  size_t sVar8;
  uint64_t uVar9;
  ulong uVar10;
  size_t i;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  timespec tStack_2360;
  __time_t _Stack_2350;
  int in_stack_ffffffffffffdcb8;
  long local_2330;
  long local_2328;
  uint64_t local_2308 [5];
  uint64_t local_22e0;
  void *local_22d8;
  ptls_aead_context_t *local_22d0;
  ulong local_22c8;
  char *local_22c0;
  char *local_22b8;
  ulong local_22b0;
  uint8_t secret [32];
  char HW [128];
  char OS [128];
  char local_2188 [138];
  utsname uts;
  uint8_t *v_enc [1000];
  
  iVar14 = 10000000;
  uVar3 = bench_time();
  uVar16 = 0;
  uVar10 = 0xdeadbeef;
  do {
    uVar13 = uVar10;
    uVar12 = (uint)uVar13;
    uVar10 = (ulong)((uVar12 << 0x1d | uVar12 >> 3) + uVar12 ^ (uint)uVar16);
    iVar14 = iVar14 + -1;
    uVar16 = uVar13;
  } while (iVar14 != 0);
  uVar4 = bench_time();
  OS[0] = '\0';
  HW[0] = '\0';
  iVar14 = uname((utsname *)&uts);
  if (iVar14 == 0) {
    sVar5 = strlen(uts.sysname);
    if (sVar5 + 1 < 0x80) {
      strcpy(OS,uts.sysname);
    }
    sVar5 = strlen(uts.machine);
    if (sVar5 + 1 < 0x80) {
      strcpy(HW,uts.machine);
    }
  }
  if ((argc == 2) && (iVar14 = strcmp(argv[1],"-f"), iVar14 == 0)) {
    bVar2 = 1;
  }
  else {
    if (1 < argc) {
      main_cold_1();
      iVar14 = clock_gettime(2,&tStack_2360);
      if (iVar14 == 0) {
        in_stack_ffffffffffffdcb8 =
             (int)tStack_2360.tv_sec * 1000000 + (int)((ulong)tStack_2360.tv_nsec / 1000);
      }
      else {
        gettimeofday((timeval *)&_Stack_2350,(__timezone_ptr_t)0x0);
        in_stack_ffffffffffffdcb8 = (int)_Stack_2350 * 1000000 + in_stack_ffffffffffffdcb8;
      }
      return in_stack_ffffffffffffdcb8;
    }
    bVar2 = 0;
  }
  local_22c8 = uVar10 | uVar13 << 0x20;
  puts(
      "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,"
      );
  uVar16 = 0;
  lVar15 = 0;
  do {
    if ((bool)(~bVar2 & aead_list[uVar16].enabled_by_defaut == 0)) {
      iVar14 = 0;
      uVar10 = uVar16;
    }
    else {
      local_22b8 = aead_list[uVar16].provider;
      local_22c0 = aead_list[uVar16].algo_name;
      aead = aead_list[uVar16].aead;
      hash = aead_list[uVar16].hash;
      local_2188[0] = '\0';
      local_22b0 = uVar16;
      iVar14 = strcmp(local_22b8,"openssl");
      if (iVar14 == 0) {
        sprintf(local_2188,"%d.%d.%d%c",3,0,0,0x62);
      }
      builtin_memcpy(secret + 0x10,"zzzzzzzzzzzzzzzz",0x10);
      builtin_memcpy(secret,"zzzzzzzzzzzzzzzz",0x10);
      ctx = ptls_aead_new(aead,hash,1,secret,(char *)0x0);
      ctx_00 = ptls_aead_new(aead,hash,0,secret,(char *)0x0);
      if (ctx_00 == (ptls_aead_context_t *)0x0 || ctx == (ptls_aead_context_t *)0x0) {
        lVar15 = lVar15 + local_22c8;
        iVar14 = 0x201;
      }
      else {
        memset(v_enc,0,8000);
        local_2308[0] = 0;
        local_2308[1] = 0;
        local_2308[2] = 0;
        local_2308[3] = 0;
        __s = malloc(0x5dc);
        __ptr = (byte *)malloc(0x5dc);
        bVar17 = __ptr != (byte *)0x0 && __s != (void *)0x0;
        iVar14 = 0x201;
        if (__ptr != (byte *)0x0 && __s != (void *)0x0) {
          uVar16 = 0;
          do {
            puVar6 = (uint8_t *)malloc(0x61c);
            v_enc[uVar16] = puVar6;
            bVar17 = puVar6 != (uint8_t *)0x0;
            if (0x3e6 < uVar16) break;
            uVar16 = uVar16 + 1;
          } while (puVar6 != (uint8_t *)0x0);
          iVar14 = 0x201;
          if (puVar6 != (uint8_t *)0x0) {
            iVar14 = 0;
          }
        }
        if (bVar17) {
          local_22d0 = ctx_00;
          memset(__s,0,0x5dc);
          uVar9 = local_2308[0];
          local_22e0 = bench_time();
          lVar15 = 0;
          lVar11 = 0;
          do {
            local_2308[0] = local_2308[0] + 1;
            puVar6 = v_enc[lVar11];
            _Stack_2350 = 0x10ab15;
            (*ctx->do_encrypt)(ctx,puVar6,__s,0x5dc,local_2308[0],local_2308,0x20,
                               (ptls_aead_supplementary_encryption_t *)0x0);
            lVar15 = lVar15 + (ulong)puVar6[0x5dc];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 1000);
          sVar1 = ctx->algo->tag_size;
          local_22d8 = __s;
          uVar7 = bench_time();
          ctx_00 = local_22d0;
          lVar11 = 0;
          local_2308[0] = uVar9;
          do {
            local_2308[0] = local_2308[0] + 1;
            _Stack_2350 = 0x10ab90;
            sVar8 = (*ctx_00->do_decrypt)
                              (ctx_00,__ptr,v_enc[lVar11],sVar1 + 0x5dc,local_2308[0],local_2308,
                               0x20);
            if (sVar8 != 0x5dc) {
              iVar14 = 0x33;
              goto LAB_0010abcf;
            }
            lVar15 = lVar15 + (ulong)*__ptr;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 1000);
          iVar14 = 0;
LAB_0010abcf:
          uVar9 = bench_time();
          local_2330 = uVar9 - uVar7;
          local_2328 = uVar7 - local_22e0;
          __s = local_22d8;
        }
        else {
          lVar15 = 0;
          local_2328 = 0;
          local_2330 = 0;
        }
        if (__s != (void *)0x0) {
          free(__s);
        }
        lVar11 = 0;
        do {
          if (v_enc[lVar11] != (uint8_t *)0x0) {
            free(v_enc[lVar11]);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 1000);
        if (__ptr != (byte *)0x0) {
          free(__ptr);
        }
        if (iVar14 == 0) {
          auVar18._8_4_ = (int)((ulong)local_2328 >> 0x20);
          auVar18._0_8_ = local_2328;
          auVar18._12_4_ = 0x45300000;
          auVar19._8_4_ = (int)((ulong)local_2330 >> 0x20);
          auVar19._0_8_ = local_2330;
          auVar19._12_4_ = 0x45300000;
          _Stack_2350 = local_2328;
          tStack_2360.tv_nsec = 0x5dc;
          tStack_2360.tv_sec = 1000;
          printf("%s, %s, %d, %s, %d, %s, %s, %s, %d, %d, %d, %d, %.2f, %.2f\n",
                 12000000.0 /
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2328) - 4503599627370496.0)),
                 12000000.0 /
                 ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2330) - 4503599627370496.0)),OS,HW,0x40,
                 "release",(ulong)(uint)((int)uVar4 - (int)uVar3),local_22b8,local_2188,local_22c0);
          iVar14 = 0;
        }
      }
      if (ctx != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(ctx);
      }
      uVar10 = local_22b0;
      if (ctx_00 != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(ctx_00);
        uVar10 = local_22b0;
      }
    }
    if ((iVar14 != 0) || (uVar16 = uVar10 + 1, 6 < uVar10)) {
      if (lVar15 == 0) {
        printf("Unexpected value of test sum s = %llx\n",0);
      }
      return iVar14;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;
    int force_all_tests = 0;
    uint64_t x = 0xdeadbeef;
    uint64_t s = 0;
    int basic_ref = bench_basic(&x);
    char OS[128];
    char HW[128];
#ifndef _WINDOWS
    struct utsname uts;
#endif

#ifdef _WINDOWS
    (void)strcpy_s(OS, sizeof(OS), "windows");
    (void)strcpy_s(HW, sizeof(HW), "x86_64");
#else
    OS[0] = 0;
    HW[0] = 0;
    if (uname(&uts) == 0) {
        if (strlen(uts.sysname) + 1 < sizeof(OS)) {
            strcpy(OS, uts.sysname);
        }
        if (strlen(uts.machine) + 1 < sizeof(HW)) {
            strcpy(HW, uts.machine);
        }
    }
#endif

#ifdef PTLS_HAVE_MBEDTLS
    if (psa_crypto_init() != PSA_SUCCESS) {
        fprintf(stderr, "psa_crypto_init fails.\n");
        exit(-1);
    }
#endif

    if (argc == 2 && strcmp(argv[1], "-f") == 0) {
        force_all_tests = 1;
    } else if (argc > 1) {
        fprintf(stderr, "Usage: %s [-f]\n   Use option \"-f\" to force execution of the slower tests.\n", argv[0]);
        exit(-1);
    }

    printf(
        "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,\n");

    for (size_t i = 0; ret == 0 && i < nb_aead_list; i++) {
        if (aead_list[i].enabled_by_defaut || force_all_tests) {
            ret = bench_run_aead(OS, HW, basic_ref, x, aead_list[i].provider, aead_list[i].algo_name, aead_list[i].aead,
                                 aead_list[i].hash, 1000, 1500, &s);
        }
    }

    /* Gratuitous test, designed to ensure that the initial computation
     * of the basic reference benchmark is not optimized away. */
    if (s == 0) {
        printf("Unexpected value of test sum s = %llx\n", (unsigned long long)s);
    }

#ifdef PTLS_HAVE_MBEDTLS
    /* Deinitialize the PSA crypto library. */
    mbedtls_psa_crypto_free();
#endif

    return ret;
}